

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

int PARMCI_GetV(armci_giov_t *darr,int len,int proc)

{
  int iVar1;
  comex_giov_t *b;
  
  b = (comex_giov_t *)malloc((long)len * 0x18);
  convert_giov(darr,b,len);
  iVar1 = comex_getv(b,len,proc,0);
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_GetV(armci_giov_t *darr, int len, int proc)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_getv(adarr, len, proc, COMEX_GROUP_WORLD);
    free(adarr);
    return rc;
}